

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int stbi_jpeg_test_memory(stbi_uc *buffer,int len)

{
  int iVar1;
  jpeg j;
  
  j.s.img_file = (FILE *)0x0;
  j.s.img_buffer_end = buffer + len;
  j.s.img_buffer = buffer;
  iVar1 = decode_jpeg_header(&j,1);
  return iVar1;
}

Assistant:

int stbi_jpeg_test_memory(stbi_uc const *buffer, int len)
{
   jpeg j;
   start_mem(&j.s, buffer,len);
   return decode_jpeg_header(&j, SCAN_type);
}